

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.h
# Opt level: O0

int64_t __thiscall ProgramStreamDemuxer::getTrackDelay(ProgramStreamDemuxer *this,int32_t pid)

{
  bool bVar1;
  mapped_type *pmVar2;
  long local_48;
  _Self local_30;
  _Self local_28;
  int32_t local_1c;
  ProgramStreamDemuxer *pPStack_18;
  int32_t pid_local;
  ProgramStreamDemuxer *this_local;
  
  local_1c = pid;
  pPStack_18 = this;
  local_28._M_node =
       (_Base_ptr)
       std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::find
                 (&this->m_firstPtsTime,&local_1c);
  local_30._M_node =
       (_Base_ptr)
       std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::end
                 (&this->m_firstPtsTime);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    pmVar2 = std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::
             operator[](&this->m_firstPtsTime,&local_1c);
    if (this->m_firstVideoPTS == -1) {
      local_48 = this->m_firstPTS;
    }
    else {
      local_48 = this->m_firstVideoPTS;
    }
    this_local = (ProgramStreamDemuxer *)llround((double)(*pmVar2 - local_48) / 90.0);
  }
  else {
    this_local = (ProgramStreamDemuxer *)0x0;
  }
  return (int64_t)this_local;
}

Assistant:

int64_t getTrackDelay(const int32_t pid) override
    {
        if (m_firstPtsTime.find(pid) != m_firstPtsTime.end())
            return llround(
                static_cast<double>(m_firstPtsTime[pid] - (m_firstVideoPTS != -1 ? m_firstVideoPTS : m_firstPTS)) /
                90.0);  // convert to ms

        return 0;
    }